

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoSimdSplat<wabt::interp::Simd<float,(unsigned_char)4>,float>(Thread *this)

{
  float __tmp;
  long lVar1;
  Value VVar2;
  Simd<float,_(unsigned_char)__x04_> result;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  VVar2 = Pop(this);
  lVar1 = 0;
  do {
    *(u32 *)((long)&local_18 + lVar1) = VVar2.field_0.i32_;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x10);
  Push(this,(Value)local_18.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSplat() {
  auto val = Pop<T>();
  R result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}